

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PcacheInitialize(void)

{
  int iVar1;
  
  if (sqlite3Config.pcache2.xInit == (_func_int_void_ptr *)0x0) {
    sqlite3PCacheSetDefault();
  }
  iVar1 = (*sqlite3Config.pcache2.xInit)(sqlite3Config.pcache2.pArg);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3PcacheInitialize(void){
  if( sqlite3GlobalConfig.pcache2.xInit==0 ){
    /* IMPLEMENTATION-OF: R-26801-64137 If the xInit() method is NULL, then the
    ** built-in default page cache is used instead of the application defined
    ** page cache. */
    sqlite3PCacheSetDefault();
    assert( sqlite3GlobalConfig.pcache2.xInit!=0 );
  }
  return sqlite3GlobalConfig.pcache2.xInit(sqlite3GlobalConfig.pcache2.pArg);
}